

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O1

void spdlog::details::os::_thread_name(char *name,size_t length)

{
  int iVar1;
  undefined8 *puVar2;
  spdlog_ex *this;
  int *piVar3;
  uint *local_60;
  undefined8 local_58;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string local_40;
  
  if (length < 0x10) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Error! Insufficient buffer length.","");
    *puVar2 = &PTR__spdlog_ex_001b0b00;
    puVar2[1] = puVar2 + 3;
    if (local_60 == &local_50) {
      *(uint *)(puVar2 + 3) = local_50;
      *(undefined4 *)((long)puVar2 + 0x1c) = uStack_4c;
      *(undefined4 *)(puVar2 + 4) = uStack_48;
      *(undefined4 *)((long)puVar2 + 0x24) = uStack_44;
    }
    else {
      puVar2[1] = local_60;
      puVar2[3] = CONCAT44(uStack_4c,local_50);
    }
    puVar2[2] = local_58;
    local_58 = 0;
    local_50 = local_50 & 0xffffff00;
    local_60 = &local_50;
    __cxa_throw(puVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  iVar1 = prctl(0x10,name);
  if (iVar1 != -1) {
    return;
  }
  this = (spdlog_ex *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Warning! Thread name get failed.","");
  piVar3 = __errno_location();
  spdlog_ex::spdlog_ex(this,&local_40,*piVar3);
  __cxa_throw(this,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

inline void _thread_name(char * name, size_t length)
{    
#ifdef _WIN32
    HANDLE threadHandle = ::OpenThread(THREAD_QUERY_INFORMATION, false, static_cast<DWORD>(thread_id()));
    if (threadHandle)
    {
	wchar_t* data;
	HRESULT hr = ::GetThreadDescription(threadHandle, &data);
	if (SUCCEEDED(hr))
	{ 
	    std::wcstombs(name, data, length);
	    ::LocalFree(data);
	}
    }

    ::CloseHandle(threadHandle);
#else
    static const size_t    THREAD_NAME_LENGTH = 16;  // Length is restricted by the OS. Includes null-termination.
    
    if (THREAD_NAME_LENGTH <= length)
    {
        int retval = 0;
        
        retval = prctl(PR_GET_NAME, name);
        if (-1 == retval)
        {
	    throw spdlog_ex("Warning! Thread name get failed.", errno);
        }
    }
    else
    {
        throw spdlog_ex("Error! Insufficient buffer length.");
    }
#endif
}